

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O3

void __thiscall
skiwi::anon_unknown_23::c_input_test_8ints::~c_input_test_8ints(c_input_test_8ints *this)

{
  compile_fixture::~compile_fixture(&this->super_compile_fixture);
  operator_delete(this,0x298);
  return;
}

Assistant:

void test()
      {
      std::stringstream str, str2;
      std::string script = R"(
(c-input "(int a, int b, int c, int d, int e, int f, int g, int h) " )

(+ a b c d e f g h)
)";
      bool error = false;
      asmcode code;
      try
        {
        code = get_asmcode(script);
        }
      catch (std::logic_error e)
        {
        error = true;
        str << e.what();
        }
      if (!error)
        {
        first_pass_data d;
        uint64_t size;
        fun_ptr f = (fun_ptr)assemble(size, d, code);
        if (f)
          {
          // important to cast to int64_t. Otherwise 32-bit version dword [rsp] is used to pass parameters, and there will be bagger in the upper half of the 64-bit register.
          uint64_t res = f(&ctxt, (int64_t)1, (int64_t)2, (int64_t)3, (int64_t)4, (int64_t)5, (int64_t)6, (int64_t)7, (int64_t)8);
          scheme_runtime(res, str, env, rd, nullptr);

          uint64_t res2 = f(&ctxt, (int64_t)0, (int64_t)1, (int64_t)3, (int64_t)4, (int64_t)0, (int64_t)0, (int64_t)0, (int64_t)8);
          scheme_runtime(res2, str2, env, rd, nullptr);

          compiled_functions.emplace_back(f, size);
          }
        }
      TEST_EQ("36", str.str());
      TEST_EQ("16", str2.str());
      }